

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O3

AssertionResult * __thiscall
testing::AssertionResult::operator<<(AssertionResult *this,char (*value) [5])

{
  char cVar1;
  size_t sVar2;
  ostream *poVar3;
  long *local_20;
  
  testing::Message::Message((Message *)&local_20);
  poVar3 = (ostream *)(local_20 + 2);
  sVar2 = strlen(*value);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,*value,sVar2);
  AppendMessage(this,(Message *)&local_20);
  if (local_20 != (long *)0x0) {
    cVar1 = testing::internal::IsTrue(true);
    if ((cVar1 != '\0') && (local_20 != (long *)0x0)) {
      (**(code **)(*local_20 + 8))();
    }
  }
  return this;
}

Assistant:

AssertionResult& operator<<(const T& value) {
    AppendMessage(Message() << value);
    return *this;
  }